

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O2

QItemSelection * __thiscall
QItemSelectionModelPrivate::expandSelection
          (QItemSelection *__return_storage_ptr__,QItemSelectionModelPrivate *this,
          QItemSelection *selection,SelectionFlags command)

{
  QAbstractItemModel *pQVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
  *pQVar6;
  int i;
  ulong uVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<QItemSelectionRange> local_b0;
  QModelIndex local_98;
  QModelIndex local_78;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = (selection->super_QList<QItemSelectionRange>).d.size;
  if (((uint)command.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
             super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i & 0x60) == 0 && uVar4 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_0040272e:
      __stack_chk_fail();
    }
    QArrayDataPointer<QItemSelectionRange>::QArrayDataPointer
              ((QArrayDataPointer<QItemSelectionRange> *)__return_storage_ptr__,
               (QArrayDataPointer<QItemSelectionRange> *)selection);
  }
  else {
    (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.size = 0;
    (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.d = (Data *)0x0;
    (__return_storage_ptr__->super_QList<QItemSelectionRange>).d.ptr = (QItemSelectionRange *)0x0;
    if (((uint)command.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
               super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i & 0x20) != 0) {
      pQVar6 = &this->model;
      lVar5 = 0;
      for (uVar7 = 0; uVar7 < uVar4; uVar7 = uVar7 + 1) {
        local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        QPersistentModelIndex::parent
                  (&local_58,
                   (QPersistentModelIndex *)
                   ((long)&(((selection->super_QList<QItemSelectionRange>).d.ptr)->tl).d + lVar5));
        QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
        ::value(pQVar6);
        pQVar1 = (pQVar6->super_QPropertyData<QAbstractItemModel_*>).val;
        iVar2 = (*(pQVar1->super_QObject)._vptr_QObject[0x10])(pQVar1,&local_58);
        local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
        ::value(pQVar6);
        pQVar1 = (pQVar6->super_QPropertyData<QAbstractItemModel_*>).val;
        uVar3 = QPersistentModelIndex::row
                          ((QPersistentModelIndex *)
                           ((long)&(((selection->super_QList<QItemSelectionRange>).d.ptr)->tl).d +
                           lVar5));
        (*(pQVar1->super_QObject)._vptr_QObject[0xc])(&local_78,pQVar1,(ulong)uVar3,0,&local_58);
        local_98.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_98.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
        ::value(pQVar6);
        pQVar1 = (pQVar6->super_QPropertyData<QAbstractItemModel_*>).val;
        uVar3 = QPersistentModelIndex::row
                          ((QPersistentModelIndex *)
                           ((long)&(((selection->super_QList<QItemSelectionRange>).d.ptr)->br).d +
                           lVar5));
        (*(pQVar1->super_QObject)._vptr_QObject[0xc])
                  (&local_98,pQVar1,(ulong)uVar3,(ulong)(iVar2 - 1),&local_58);
        QItemSelection::QItemSelection((QItemSelection *)&local_b0,&local_78,&local_98);
        QItemSelection::merge
                  (__return_storage_ptr__,(QItemSelection *)&local_b0,(SelectionFlags)0x2);
        QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_b0);
        uVar4 = (selection->super_QList<QItemSelectionRange>).d.size;
        lVar5 = lVar5 + 0x10;
      }
    }
    if (((uint)command.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
               super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i & 0x40) != 0) {
      pQVar6 = &this->model;
      lVar5 = 0;
      for (uVar7 = 0; uVar7 < uVar4; uVar7 = uVar7 + 1) {
        local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        QPersistentModelIndex::parent
                  (&local_58,
                   (QPersistentModelIndex *)
                   ((long)&(((selection->super_QList<QItemSelectionRange>).d.ptr)->tl).d + lVar5));
        QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
        ::value(pQVar6);
        pQVar1 = (pQVar6->super_QPropertyData<QAbstractItemModel_*>).val;
        iVar2 = (*(pQVar1->super_QObject)._vptr_QObject[0xf])(pQVar1,&local_58);
        local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
        ::value(pQVar6);
        pQVar1 = (pQVar6->super_QPropertyData<QAbstractItemModel_*>).val;
        uVar3 = QPersistentModelIndex::column
                          ((QPersistentModelIndex *)
                           ((long)&(((selection->super_QList<QItemSelectionRange>).d.ptr)->tl).d +
                           lVar5));
        (*(pQVar1->super_QObject)._vptr_QObject[0xc])(&local_78,pQVar1,0,(ulong)uVar3,&local_58);
        local_98.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_98.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
        ::value(pQVar6);
        pQVar1 = (pQVar6->super_QPropertyData<QAbstractItemModel_*>).val;
        uVar3 = QPersistentModelIndex::column
                          ((QPersistentModelIndex *)
                           ((long)&(((selection->super_QList<QItemSelectionRange>).d.ptr)->br).d +
                           lVar5));
        (*(pQVar1->super_QObject)._vptr_QObject[0xc])
                  (&local_98,pQVar1,(ulong)(iVar2 - 1),(ulong)uVar3,&local_58);
        QItemSelection::QItemSelection((QItemSelection *)&local_b0,&local_78,&local_98);
        QItemSelection::merge
                  (__return_storage_ptr__,(QItemSelection *)&local_b0,(SelectionFlags)0x2);
        QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_b0);
        uVar4 = (selection->super_QList<QItemSelectionRange>).d.size;
        lVar5 = lVar5 + 0x10;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_0040272e;
  }
  return __return_storage_ptr__;
}

Assistant:

QItemSelection QItemSelectionModelPrivate::expandSelection(const QItemSelection &selection,
                                                           QItemSelectionModel::SelectionFlags command) const
{
    if (selection.isEmpty() && !((command & QItemSelectionModel::Rows) ||
                                 (command & QItemSelectionModel::Columns)))
        return selection;

    QItemSelection expanded;
    if (command & QItemSelectionModel::Rows) {
        for (int i = 0; i < selection.size(); ++i) {
            QModelIndex parent = selection.at(i).parent();
            int colCount = model->columnCount(parent);
            QModelIndex tl = model->index(selection.at(i).top(), 0, parent);
            QModelIndex br = model->index(selection.at(i).bottom(), colCount - 1, parent);
            //we need to merge because the same row could have already been inserted
            expanded.merge(QItemSelection(tl, br), QItemSelectionModel::Select);
        }
    }
    if (command & QItemSelectionModel::Columns) {
        for (int i = 0; i < selection.size(); ++i) {
            QModelIndex parent = selection.at(i).parent();
            int rowCount = model->rowCount(parent);
            QModelIndex tl = model->index(0, selection.at(i).left(), parent);
            QModelIndex br = model->index(rowCount - 1, selection.at(i).right(), parent);
            //we need to merge because the same column could have already been inserted
            expanded.merge(QItemSelection(tl, br), QItemSelectionModel::Select);
        }
    }
    return expanded;
}